

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_true,_true>::append_edge_(DaTrie<false,_true,_true> *this,Query *query)

{
  byte bVar1;
  uint uVar2;
  pointer pBVar3;
  char *pcVar4;
  pointer pNVar5;
  uint node_pos;
  ulong uVar6;
  
  bVar1 = query->key_[query->pos_];
  uVar6 = (ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  if (this->head_pos_ != 0xffffffff) {
    uVar6 = (ulong)this->head_pos_;
  }
  node_pos = (uint)uVar6;
  fix_(this,node_pos,&this->blocks_);
  *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
            super__Vector_impl_data._M_start + query->node_pos_) = (bVar1 ^ node_pos) & 0x7fffffff;
  pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar3[uVar6] =
       (Bc)((ulong)pBVar3[uVar6] & 0x80000000ffffffff |
           (ulong)(query->node_pos_ & 0x7fffffff) << 0x20);
  pcVar4 = query->key_;
  uVar2 = query->pos_;
  pNVar5 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pNVar5[query->node_pos_].child = pcVar4[uVar2];
  pNVar5[uVar6].sib = pcVar4[uVar2];
  query->node_pos_ = node_pos;
  query->pos_ = uVar2 + 1;
  query->is_finished_ = pcVar4[uVar2] == '\0';
  return;
}

Assistant:

void append_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto base = xcheck_(query.label(), blocks_);
    auto child_pos = base ^query.label();

    fix_(child_pos, blocks_);
    bc_[query.node_pos()].set_base(base);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      node_links_[query.node_pos()].child = query.label();
      node_links_[child_pos].sib = query.label();
    }
    query.next(child_pos);
  }